

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

bool __thiscall rcg::Buffer::getDataLargerThanBuffer(Buffer *this)

{
  bool bVar1;
  undefined8 *in_RDI;
  void *unaff_retaddr;
  void *in_stack_00000008;
  
  Stream::getHandle((Stream *)*in_RDI);
  bVar1 = anon_unknown_5::getBufferBool
                    ((shared_ptr<const_rcg::GenTLWrapper> *)this,in_stack_00000008,unaff_retaddr,
                     (BUFFER_INFO_CMD)((ulong)in_RDI >> 0x20));
  return bVar1;
}

Assistant:

bool Buffer::getDataLargerThanBuffer() const
{
  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_DATA_LARGER_THAN_BUFFER);
}